

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O3

enable_if_t<std::is_unsigned<unsigned_int>::value,_unsigned_int> __thiscall
burst::divceil<unsigned_int,unsigned_short>
          (burst *this,Integer<unsigned_int> n,Integer<unsigned_short> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_int>::value,_unsigned_int> eVar1;
  domain_error *this_00;
  
  if (n != 0) {
    if ((int)this == 0) {
      eVar1 = 0;
    }
    else {
      eVar1 = (int)((ulong)((int)this - 1) / ((ulong)n & 0xffff)) + 1;
    }
    return eVar1;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this_00,anon_var_dwarf_1f0b1);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }